

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImGuiTabItem>::push_back(ImVector<ImGuiTabItem> *this,ImGuiTabItem *v)

{
  ImGuiTabItem *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ImGuiTabItem *pIVar4;
  ImS32 IVar5;
  float fVar6;
  float fVar7;
  ImGuiID IVar8;
  ImGuiTabItemFlags IVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  iVar11 = this->Size;
  if (iVar11 == this->Capacity) {
    if (iVar11 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar11 / 2 + iVar11;
    }
    iVar12 = iVar11 + 1;
    if (iVar11 + 1 < iVar10) {
      iVar12 = iVar10;
    }
    reserve(this,iVar12);
    iVar11 = this->Size;
  }
  pIVar1 = this->Data;
  IVar8 = v->ID;
  IVar9 = v->Flags;
  iVar10 = v->LastFrameVisible;
  iVar12 = v->LastFrameSelected;
  fVar6 = v->Offset;
  fVar7 = v->Width;
  uVar2 = *(undefined8 *)&v->ContentWidth;
  IVar5 = v->NameOffset;
  uVar3 = *(undefined8 *)&v->BeginOrder;
  pIVar4 = pIVar1 + iVar11;
  pIVar4->RequestedWidth = v->RequestedWidth;
  pIVar4->NameOffset = IVar5;
  *(undefined8 *)(&pIVar4->RequestedWidth + 2) = uVar3;
  pIVar4 = pIVar1 + iVar11;
  pIVar4->Offset = fVar6;
  pIVar4->Width = fVar7;
  *(undefined8 *)(&pIVar4->Offset + 2) = uVar2;
  pIVar1 = pIVar1 + iVar11;
  pIVar1->ID = IVar8;
  pIVar1->Flags = IVar9;
  pIVar1->LastFrameVisible = iVar10;
  pIVar1->LastFrameSelected = iVar12;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }